

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,ByteData *byte_data)

{
  wally_psbt *psbt;
  CfdException *pCVar1;
  allocator local_6d;
  int ret;
  size_t is_elements;
  undefined1 local_60 [64];
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_00654960;
  Transaction::Transaction(&this->base_tx_);
  psbt = ParsePsbtData(byte_data);
  is_elements = 0;
  ret = wally_psbt_is_elements(psbt,&is_elements);
  if (ret != 0) {
    wally_psbt_free(psbt);
    local_60._0_8_ = "cfdcore_psbt.cpp";
    local_60._8_4_ = 0x70f;
    local_60._16_8_ = (long)"CfdIsFinalizedPsbt" + 0xe;
    logger::warn<int&>((CfdSourceLocation *)local_60,"wally_psbt_is_elements NG[{}]",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_60,"psbt elements check error.",&local_6d);
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_60);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_elements == 0) {
    this->wally_psbt_pointer_ = psbt;
    RebuildTransaction((Transaction *)local_60,psbt);
    Transaction::operator=(&this->base_tx_,(Transaction *)local_60);
    Transaction::~Transaction((Transaction *)local_60);
    return;
  }
  wally_psbt_free(psbt);
  local_60._0_8_ = "cfdcore_psbt.cpp";
  local_60._8_4_ = 0x714;
  local_60._16_8_ = (long)"CfdIsFinalizedPsbt" + 0xe;
  logger::warn<>((CfdSourceLocation *)local_60,"psbt elements format.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_60,"psbt bitcoin tx format error.",&local_6d);
  CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_60);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Psbt::Psbt(const ByteData &byte_data) {
  struct wally_psbt *psbt_pointer = ParsePsbtData(byte_data);
  size_t is_elements = 0;
  int ret = wally_psbt_is_elements(psbt_pointer, &is_elements);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "wally_psbt_is_elements NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt elements check error.");
  }
  if (is_elements != 0) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "psbt elements format.");
    throw CfdException(kCfdInternalError, "psbt bitcoin tx format error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}